

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_hatch.cpp
# Opt level: O1

bool __thiscall ON_HatchLoop::SetCurve(ON_HatchLoop *this,ON_Curve *curve)

{
  int iVar1;
  undefined4 extraout_var;
  ON_Curve *pOVar2;
  
  iVar1 = (*(curve->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x24])(curve);
  pOVar2 = (ON_Curve *)CONCAT44(extraout_var,iVar1);
  if (pOVar2 != (ON_Curve *)0x0) {
    iVar1 = (*(pOVar2->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x18])(pOVar2);
    if ((iVar1 == 3) &&
       (iVar1 = (*(pOVar2->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x28])(pOVar2,2),
       (char)iVar1 == '\0')) {
      return false;
    }
    if (this->m_p2dCurve != (ON_Curve *)0x0) {
      (*(this->m_p2dCurve->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])();
    }
    this->m_p2dCurve = pOVar2;
  }
  return true;
}

Assistant:

bool ON_HatchLoop::SetCurve( const ON_Curve& curve)
{
  ON_Curve* pC = curve.DuplicateCurve();
  if( pC)
  {
    if(pC->Dimension() == 3 && !pC->ChangeDimension(2))
      return false;

    if( m_p2dCurve)
      delete m_p2dCurve;
    m_p2dCurve = pC;
  }
  return true;
}